

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O1

int use_stethoscope(obj *obj)

{
  short sVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  obj *poVar7;
  uint uVar8;
  xchar y;
  monst *pmVar9;
  ulong uVar10;
  char *line;
  rm *loc;
  xchar x;
  bool bVar11;
  bool bVar12;
  schar dy;
  schar dx;
  schar dz;
  int res;
  char local_4b;
  char local_4a;
  char local_49;
  uint local_48;
  uint local_44;
  ulong local_40;
  monst *local_38;
  
  sVar1 = urole.malenum;
  if (((u._1052_1_ & 1) == 0) ||
     ((u.ustuck)->data != mons + 0x9f && (u.ustuck)->data->mlet != '\x16')) {
    bVar11 = false;
  }
  else {
    uVar3 = mt_random();
    uVar8 = 3;
    if (sVar1 == 0x15e) {
      uVar8 = 10;
    }
    bVar11 = uVar3 % uVar8 == 0;
  }
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pline("You have no hands!");
    return 0;
  }
  iVar4 = freehand();
  if (iVar4 == 0) {
    pcVar6 = body_part(6);
    pline("You have no free %s.",pcVar6);
    return 0;
  }
  iVar4 = getdir((char *)0x0,&local_4a,&local_4b,&local_49);
  if (iVar4 == 0) {
    return 0;
  }
  iVar4 = (int)youmonst.movement;
  bVar12 = stetho_last_used_movement == iVar4 && stetho_last_used_move == moves;
  uVar3 = (uint)bVar12;
  uVar8 = (uint)bVar12;
  stetho_last_used_move = moves;
  stetho_last_used_movement = iVar4;
  local_44 = uVar8;
  if (local_49 < '\x01' || u.usteed == (monst *)0x0) {
    if (((u._1052_1_ & 1) != 0) &&
       (pmVar9 = u.ustuck, (local_4b != '\0' || local_4a != '\0') || local_49 != '\0'))
    goto LAB_00146363;
    if ((bVar11 & u._1052_1_) == 0) {
      if (local_49 != '\0') {
        if ((u._1052_1_ & 2) != 0) {
          pcVar6 = "faint splashing.";
LAB_001463fe:
          You_hear(pcVar6);
          return local_44;
        }
        if ((local_49 < '\0') || (bVar2 = can_reach_floor(), bVar2 == '\0')) {
          if (local_49 < '\x01') {
            pcVar6 = ceiling((int)u.ux,(int)u.uy);
          }
          else {
            pcVar6 = surface((int)u.ux,(int)u.uy);
          }
          line = "You can\'t reach the %s.";
        }
        else {
          bVar2 = its_dead((int)u.ux,(int)u.uy,(int *)&local_44,obj);
          if (bVar2 != '\0') {
            return local_44;
          }
          bVar2 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
          if (bVar2 != '\0') {
            pcVar6 = "the crackling of hellfire.";
            goto LAB_001463fe;
          }
          pcVar6 = surface((int)u.ux,(int)u.uy);
          line = "The %s seems healthy enough.";
        }
        pline(line,pcVar6);
        return local_44;
      }
      if (((obj->field_0x4a & 1) != 0) && (uVar5 = mt_random(), (uVar5 & 1) == 0)) {
        pcVar6 = "your heart beat.";
LAB_0014657a:
        You_hear(pcVar6);
        return uVar3;
      }
      if (((u.uprops[0x1b].intrinsic != 0) ||
          ((u.umonnum == 0x9e || ((youmonst.data)->mlet == '\x1c')))) ||
         ((u.uprops[0x1c].intrinsic != 0 && (uVar3 = mt_random(), uVar3 * -0x33333333 < 0x33333334))
         )) {
        confdir(&local_4a,&local_4b);
      }
      if (local_4a == '\0' && local_4b == '\0') {
        ustatusline();
        return uVar8;
      }
      uVar3 = (int)u.uy + (int)local_4b;
      if (0x4e < ((int)u.ux + (int)local_4a) - 1U || 0x14 < uVar3) {
        pcVar6 = "a faint typing noise.";
        uVar3 = 0;
        goto LAB_0014657a;
      }
      uVar5 = (int)u.ux + (int)local_4a;
      uVar10 = (ulong)uVar5;
      pmVar9 = level->monsters[uVar10][uVar3];
      local_38 = (monst *)0x0;
      if ((pmVar9 != (monst *)0x0) && ((pmVar9->field_0x61 & 2) == 0)) {
        local_38 = pmVar9;
      }
      local_48 = uVar3;
      local_40 = uVar10;
      if (local_38 == (monst *)0x0) {
        if ((level->locations[uVar10][uVar3].field_0x6 & 8) != 0) {
          unmap_object(uVar5,uVar3);
          newsym((int)local_40,local_48);
          pline("The invisible monster must have moved.");
        }
        loc = level->locations[uVar10] + uVar3;
        if (loc->typ == '\x10') {
          You_hear("a hollow sound.  This must be a secret %s!","passage");
          uVar10 = local_40;
          uVar3 = local_48;
          loc->typ = '\x18';
          iVar4 = (int)local_40;
          unblock_point(iVar4,local_48);
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) goto LAB_001467db;
          x = (xchar)uVar10;
          y = (xchar)uVar3;
        }
        else {
          if (loc->typ != '\x0f') {
            bVar2 = its_dead((int)local_40,local_48,(int *)&local_44,obj);
            if (bVar2 != '\0') {
              return local_44;
            }
            pline("You hear nothing special.");
            return local_44;
          }
          You_hear("a hollow sound.  This must be a secret %s!","door");
          cvt_sdoor_to_door(loc,&u.uz);
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            iVar4 = (int)local_40;
            uVar3 = local_48;
LAB_001467db:
            newsym(iVar4,uVar3);
            return uVar8;
          }
          x = (xchar)local_40;
          y = (xchar)local_48;
        }
        feel_location(x,y);
        return uVar8;
      }
      mstatusline(local_38);
      if (((char)*(uint *)&local_38->field_0x60 < '\0') &&
         (*(uint *)&local_38->field_0x60 = *(uint *)&local_38->field_0x60 & 0xffffff7f,
         (viz_array[uVar3][uVar10] & 2U) != 0)) {
        newsym((int)local_38->mx,(int)local_38->my);
      }
      if (local_38->wormno == '\0') {
        if (((viz_array[local_38->my][local_38->mx] & 2U) == 0) &&
           ((((u.uprops[0x1e].intrinsic != 0 ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
            (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
              (((youmonst.data)->mflags3 & 0x100) == 0)) ||
             (((viz_array[local_38->my][local_38->mx] & 1U) == 0 ||
              ((local_38->data->mflags3 & 0x200) == 0)))))))) goto LAB_00146883;
      }
      else {
        bVar2 = worm_known(level,local_38);
        if (bVar2 == '\0') goto LAB_00146883;
      }
      uVar3 = *(uint *)&local_38->field_0x60;
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar3 & 0x280) != 0) goto LAB_00146883;
      }
      else if (((uVar3 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
      goto LAB_00146883;
      if ((u._1052_1_ & 0x20) == 0) {
        return uVar8;
      }
LAB_00146883:
      if (((local_38->data->mflags1 & 0x10000) == 0) &&
         ((poVar7 = which_armor(local_38,4), poVar7 == (obj *)0x0 ||
          (poVar7 = which_armor(local_38,4), poVar7->otyp != 0x4f)))) {
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
            ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
              (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
              youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) {
          return uVar8;
        }
        if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
           (iVar4 = dist2((int)local_38->mx,(int)local_38->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)) {
          return uVar8;
        }
      }
      if (u.uprops[0x42].intrinsic != 0) {
        return uVar8;
      }
      if (u.uprops[0x42].extrinsic != 0) {
        return uVar8;
      }
      bVar2 = match_warn_of_mon(local_38);
      if (bVar2 != '\0') {
        return uVar8;
      }
      map_invisible((xchar)local_40,(xchar)local_48);
      return uVar8;
    }
  }
  else {
    pmVar9 = u.usteed;
    if (bVar11 == false) goto LAB_00146363;
  }
  pcVar6 = Monnam(u.ustuck);
  pline("%s interferes.",pcVar6);
  pmVar9 = u.ustuck;
LAB_00146363:
  mstatusline(pmVar9);
  return uVar8;
}

Assistant:

static int use_stethoscope(struct obj *obj)
{
	struct monst *mtmp;
	struct rm *loc;
	int rx, ry, res;
	schar dx, dy, dz;
	boolean interference = (u.uswallow && is_whirly(u.ustuck->data) &&
				!rn2(Role_if (PM_HEALER) ? 10 : 3));

	if (nohands(youmonst.data)) {	/* should also check for no ears and/or deaf */
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}
	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;

	res = (moves == stetho_last_used_move) &&
	      (youmonst.movement == stetho_last_used_movement);
	stetho_last_used_move = moves;
	stetho_last_used_movement = youmonst.movement;

	if (u.usteed && dz > 0) {
		if (interference) {
			pline("%s interferes.", Monnam(u.ustuck));
			mstatusline(u.ustuck);
		} else
			mstatusline(u.usteed);
		return res;
	} else if (u.uswallow && (dx || dy || dz)) {
		mstatusline(u.ustuck);
		return res;
	} else if (u.uswallow && interference) {
		pline("%s interferes.", Monnam(u.ustuck));
		mstatusline(u.ustuck);
		return res;
	} else if (dz) {
		if (Underwater)
		    You_hear("faint splashing.");
		else if (dz < 0 || !can_reach_floor())
		    pline("You can't reach the %s.",
			(dz > 0) ? surface(u.ux, u.uy) : ceiling(u.ux, u.uy));
		else if (its_dead(u.ux, u.uy, &res, obj))
		    ;	/* message already given */
		else if (Is_stronghold(&u.uz))
		    You_hear("the crackling of hellfire.");
		else
		    pline("The %s seems healthy enough.", surface(u.ux, u.uy));
		return res;
	} else if (obj->cursed && !rn2(2)) {
		You_hear("your heart beat.");
		return res;
	}
	if (Stunned || (Confusion && !rn2(5)))
	    confdir(&dx, &dy);
	if (!dx && !dy) {
		ustatusline();
		return res;
	}
	
	rx = u.ux + dx;
	ry = u.uy + dy;
	if (!isok(rx, ry)) {
		You_hear("a faint typing noise.");
		return 0;
	}
	if ((mtmp = m_at(level, rx, ry)) != 0) {
		mstatusline(mtmp);
		if (mtmp->mundetected) {
			mtmp->mundetected = 0;
			if (cansee(rx, ry)) newsym(mtmp->mx, mtmp->my);
		}
		if (!canspotmon(level, mtmp))
			map_invisible(rx, ry);
		return res;
	}
	if (level->locations[rx][ry].mem_invis) {
		unmap_object(rx, ry);
		newsym(rx, ry);
		pline("The invisible monster must have moved.");
	}
	loc = &level->locations[rx][ry];
	switch(loc->typ) {
	case SDOOR:
		You_hear(hollow_str, "door");
		cvt_sdoor_to_door(loc, &u.uz);		/* ->typ = DOOR */
		if (Blind) feel_location(rx,ry);
		else newsym(rx,ry);
		return res;
	case SCORR:
		You_hear(hollow_str, "passage");
		loc->typ = CORR;
		unblock_point(rx,ry);
		if (Blind) feel_location(rx,ry);
		else newsym(rx,ry);
		return res;
	}

	if (!its_dead(rx, ry, &res, obj))
	    pline("You hear nothing special.");	/* not You_hear()  */
	return res;
}